

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

void cf_hash_drbg_sha256_reseed
               (cf_hash_drbg_sha256 *ctx,void *entropy,size_t nentropy,void *addnl,size_t naddnl)

{
  undefined1 local_3a;
  undefined1 local_39;
  uint8_t zero;
  size_t sStack_38;
  uint8_t one;
  size_t naddnl_local;
  void *addnl_local;
  size_t nentropy_local;
  void *entropy_local;
  cf_hash_drbg_sha256 *ctx_local;
  
  local_39 = 1;
  sStack_38 = naddnl;
  naddnl_local = (size_t)addnl;
  addnl_local = (void *)nentropy;
  nentropy_local = (size_t)entropy;
  entropy_local = ctx;
  memcpy(ctx->C,ctx,0x37);
  hash_df(&cf_sha256,&local_39,1,(void *)((long)entropy_local + 0x37),0x37,(void *)nentropy_local,
          (size_t)addnl_local,(void *)naddnl_local,sStack_38,(uint8_t *)entropy_local,0x37);
  local_3a = 0;
  hash_df(&cf_sha256,&local_3a,1,entropy_local,0x37,(void *)0x0,0,(void *)0x0,0,
          (uint8_t *)((long)entropy_local + 0x37),0x37);
  *(undefined4 *)((long)entropy_local + 0x70) = 1;
  return;
}

Assistant:

void cf_hash_drbg_sha256_reseed(cf_hash_drbg_sha256 *ctx,
                                const void *entropy, size_t nentropy,
                                const void *addnl, size_t naddnl)
{
  /* 1. seed_material = 0x01 || V || entropy_input || additional_input
   * 2. seed = Hash_df(seed_material, seedlen)
   * 3. V = seed */
  uint8_t one = 1;
  /* stash V in C, because it cannot alias output */
  memcpy(ctx->C, ctx->V, sizeof ctx->C);
  hash_df(&cf_sha256,
          &one, sizeof one,
          ctx->C, sizeof ctx->C,
          entropy, nentropy,
          addnl, naddnl,
          ctx->V, sizeof ctx->V);

  /* 4. C = Hash_df(0x00 || V, seedlen) */
  uint8_t zero = 0;
  hash_df(&cf_sha256,
          &zero, sizeof zero,
          ctx->V, sizeof ctx->V,
          NULL, 0,
          NULL, 0,
          ctx->C, sizeof ctx->C);

  /* 5. reseed_counter = 1 */
  ctx->reseed_counter = 1;
}